

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TryParseExtendedUnicodeEscape
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,Char *c,
          bool *previousSurrogatePart,bool trackSurrogatePair)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  EncodedChar EVar4;
  uint uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint uVar8;
  uint codePoint;
  uint uVar9;
  char16 local_32 [4];
  char16 other;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
    if (this->inputLim < this->next + 2) {
      return 0;
    }
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00eb8276;
      *puVar6 = 0;
    }
    if (*this->next != L'{') {
      return 0;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00eb8276;
      *puVar6 = 0;
    }
    uVar7 = (ulong)(ushort)this->next[1];
    if ((uVar7 < 0x100) && ((ASCIIChars::classes[uVar7] & 0x40) != 0)) {
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) {
LAB_00eb8276:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      codePoint = 0;
      if ((ulong)(ushort)this->next[1] < 0x100) {
        codePoint = (uint)(byte)ASCIIChars::values[(ushort)this->next[1]];
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar8 = 2;
      do {
        uVar9 = uVar8 + 1;
        if (this->inputLim < this->next + uVar9) {
LAB_00eb8061:
          if (this->inputLim < this->next + uVar9) {
            return 0;
          }
          if (this->inputLim < this->next + uVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar2) goto LAB_00eb8276;
            *puVar6 = 0;
          }
          if (this->next[uVar8] != L'}') {
            return 0;
          }
          uVar9 = uVar8 + 1;
          if (uVar9 < 3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x111,"(consumptionNumber >= 3)","consumptionNumber >= 3");
            if (!bVar2) goto LAB_00eb8276;
            *puVar6 = 0;
          }
          if (((trackSurrogatePair) && (*previousSurrogatePart == false)) &&
             (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true)) {
            TrackIfSurrogatePair(this,codePoint,this->next + -1,uVar8 + 2);
          }
          if (codePoint < 0x10000) {
            CVar3 = Chars<char16_t>::UTC(codePoint);
            *c = CVar3;
          }
          else {
            if (*previousSurrogatePart != true) {
              *previousSurrogatePart = true;
              Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,c,local_32);
              EVar4 = ECLookback(this,1);
              if ((EVar4 != L'u') || (EVar4 = ECLookback(this,2), EVar4 != L'\\')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar6 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,300,"(ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\')",
                                   "ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\'");
                if (!bVar2) goto LAB_00eb8276;
                *puVar6 = 0;
              }
              ECRevert(this,2);
              return uVar9;
            }
            *previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,local_32,c);
          }
          ECConsumeMultiUnit(this,uVar9);
          return uVar9;
        }
        if (this->inputLim < this->next + uVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00eb8276;
          *puVar6 = 0;
        }
        uVar7 = (ulong)(ushort)this->next[uVar8];
        if ((0xff < uVar7) || ((ASCIIChars::classes[uVar7] & 0x40) == 0)) goto LAB_00eb8061;
        if (this->inputLim < this->next + uVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00eb8276;
          *puVar6 = 0;
        }
        uVar5 = 0;
        if ((ulong)(ushort)this->next[uVar8] < 0x100) {
          uVar5 = (uint)(byte)ASCIIChars::values[(ushort)this->next[uVar8]];
        }
        codePoint = codePoint * 0x10 + uVar5;
        uVar8 = uVar9;
      } while (codePoint < 0x110000);
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
    }
  }
  return 0;
}

Assistant:

int Parser<P, IsLiteral>::TryParseExtendedUnicodeEscape(Char& c, bool& previousSurrogatePart, bool trackSurrogatePair /* = false */)
    {
        if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            return 0;
        }

        if (!ECCanConsume(2) || ECLookahead(0) !='{' || !standardEncodedChars->IsHex(ECLookahead(1)))
        {
            return 0;
        }

        // The first character is mandatory to consume escape sequence, so we check for it above, at this stage we can set it as we already checked.
        codepoint_t codePoint = standardEncodedChars->DigitValue(ECLookahead(1));

        int i = 2;

        while(ECCanConsume(i + 1) && standardEncodedChars->IsHex(ECLookahead(i)))
        {
            codePoint <<= 4;
            codePoint += standardEncodedChars->DigitValue(ECLookahead(i));

            if (codePoint > 0x10FFFF)
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                return 0;
            }
            i++;
        }

        if(!ECCanConsume(i + 1) || ECLookahead(i) != '}')
        {
            return 0;
        }

        uint consumptionNumber = i + 1;
        Assert(consumptionNumber >= 3);

        if (!previousSurrogatePart && trackSurrogatePair && this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            // Current location
            TrackIfSurrogatePair(codePoint, (next - 1), consumptionNumber + 1);
        }

        char16 other;
        // Generally if this code point is a single character, then we take it and return.
        // If the character is made up of two characters then we emit the first and backtrack to the start of th escape sequence;
        // Following that we check if we have already seen the first character, and if so emit the second and consume the entire escape sequence.
        if (codePoint < 0x10000)
        {
            c = UTC(codePoint);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else if (previousSurrogatePart)
        {
            previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &other, &c);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else
        {
            previousSurrogatePart = true;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &c, &other);
            Assert(ECLookback(1) == 'u' && ECLookback(2) == '\\');
            ECRevert(2);
        }

        return consumptionNumber;
    }